

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O1

void __thiscall Propagator::init_compatible(Propagator *this)

{
  pointer paVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  pointer *ppuVar5;
  long lVar6;
  array<int,_4UL> value;
  
  if (this->wave_height != 0) {
    uVar2 = 0;
    do {
      if (this->wave_width != 0) {
        uVar3 = 0;
        do {
          if (this->patterns_size != 0) {
            uVar4 = 0;
            do {
              ppuVar5 = (pointer *)
                        ((long)&(this->propagator_state).
                                super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_elems[3].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl + 8);
              lVar6 = 0;
              do {
                value._M_elems[lVar6] =
                     (int)((ulong)((long)*ppuVar5 -
                                  (long)((_Vector_impl_data *)(ppuVar5 + -1))->_M_start) >> 2);
                lVar6 = lVar6 + 1;
                ppuVar5 = ppuVar5 + -3;
              } while (lVar6 != 4);
              paVar1 = (this->compatible).data.
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start +
                       ((this->compatible).width * uVar2 + uVar3) * (this->compatible).depth + uVar4
              ;
              *(undefined8 *)paVar1->_M_elems = value._M_elems._0_8_;
              *(undefined8 *)(paVar1->_M_elems + 2) = value._M_elems._8_8_;
              uVar4 = (ulong)((int)uVar4 + 1);
            } while (uVar4 < this->patterns_size);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < this->wave_width);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < this->wave_height);
  }
  return;
}

Assistant:

void Propagator::init_compatible() noexcept {
  std::array<int, 4> value;
  // We compute the number of pattern compatible in all directions.
  for (unsigned y = 0; y < wave_height; y++) {
    for (unsigned x = 0; x < wave_width; x++) {
      for (unsigned pattern = 0; pattern < patterns_size; pattern++) {
        for (int direction = 0; direction < 4; direction++) {
          value[direction] =
            static_cast<unsigned>(propagator_state[pattern][get_opposite_direction(direction)]
                                  .size());
        }
        compatible.get(y, x, pattern) = value;
      }
    }
  }
}